

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::dec_writer>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::dec_writer>
          *f)

{
  byte bVar1;
  size_t n;
  char __tmp;
  size_t __len;
  size_t __n;
  size_t __len_1;
  type pcVar2;
  ulong uVar3;
  type local_30;
  
  uVar3 = (ulong)spec->width_;
  n = f->size_;
  __n = uVar3 - n;
  if (uVar3 < n || __n == 0) {
    local_30 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                         ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,n);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::dec_writer>
                  *)f,&local_30);
  }
  else {
    local_30 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                         ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,uVar3
                         );
    bVar1 = (byte)spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar3 = __n >> 1;
      pcVar2 = local_30;
      if (1 < __n) {
        pcVar2 = local_30 + uVar3;
        memset(local_30,(uint)bVar1,uVar3);
      }
      local_30 = pcVar2;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::dec_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::dec_writer>
                    *)f,&local_30);
      __n = __n - uVar3;
    }
    else {
      if (spec->align_ == ALIGN_RIGHT) {
        pcVar2 = local_30 + __n;
        memset(local_30,(uint)bVar1,__n);
        local_30 = pcVar2;
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::dec_writer>
        ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::dec_writer>
                      *)f,&local_30);
        return;
      }
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::dec_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::dec_writer>
                    *)f,&local_30);
    }
    memset(local_30,(uint)bVar1,__n);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }